

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdType.cpp
# Opt level: O0

void __thiscall ArrayId::ArrayId(ArrayId *this,string *name,TYPE et,int dim,period *prd)

{
  string local_48 [32];
  period *local_28;
  period *prd_local;
  int dim_local;
  TYPE et_local;
  string *name_local;
  ArrayId *this_local;
  
  local_28 = prd;
  prd_local._0_4_ = dim;
  prd_local._4_4_ = et;
  _dim_local = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_48,(string *)name);
  Id::Id(&this->super_Id,(string *)local_48,_ARRAY);
  std::__cxx11::string::~string(local_48);
  this->dim = (int)prd_local;
  this->element_type = prd_local._4_4_;
  this->prd = local_28;
  return;
}

Assistant:

ArrayId::ArrayId(std::string name, TYPE et, int dim, period *prd)
    : Id(std::move(name), _ARRAY) {
    this->dim = dim;
    this->element_type = et;
    this->prd = prd;
}